

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O0

void __thiscall
nnad::FeedForwardNN<double>::SetParameters
          (FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Pars)

{
  value_type vVar1;
  size_type sVar2;
  __tuple_element_t<0UL,_tuple<bool,_int,_int,_int>_> *p_Var3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int ip_1;
  coordinates coord;
  int ip;
  __tuple_element_t<3UL,_tuple<bool,_int,_int,_int>_> *in_stack_ffffffffffffff68;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int local_5c;
  int local_48;
  double *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if ((int)sVar2 != *(int *)(in_RDI + 0xe0) + *(int *)(in_RDI + 0x98)) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Error((string *)0x112504);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  for (local_48 = 0; local_48 < *(int *)(in_RDI + 0xe0); local_48 = local_48 + 1) {
    std::
    map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
    ::at((map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
          *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    p_Var3 = std::get<0ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x1125ad);
    if ((*p_Var3 & 1U) == 0) {
      std::get<1ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x112641);
      std::
      map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
      ::at(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::get<2ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x11265d);
      in_stack_ffffffffffffff68 =
           std::get<3ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x11266c);
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_48);
      Matrix<double>::SetElement
                ((Matrix<double> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      in_stack_ffffffffffffff70 =
           (map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
            *)(in_RDI + 0xe8);
      std::get<1ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x1125cc);
      std::
      map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
      ::at(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::get<2ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x1125e8);
      std::get<3ul,bool,int,int,int>((tuple<bool,_int,_int,_int> *)0x1125f7);
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_48);
      Matrix<double>::SetElement
                ((Matrix<double> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x98); local_5c = local_5c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(*(int *)(in_RDI + 0xe0) + local_5c));
    vVar1 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)local_5c);
    *pvVar5 = vVar1;
  }
  return;
}

Assistant:

void SetParameters(std::vector<T> const& Pars)
    {
      // Check that the size of the parameter vector is equal to the
      // number of parameters of the current NN plus the number of
      // parameters of the preprocessing function.
      if ((int) Pars.size() != _Np + _NpPrep)
        Error("SetParameters: the number of parameters does not match that of the NN plus that of the preprocessing function.");

      // Set links and biases
      for (int ip = 0; ip < _Np; ip++)
        {
          const coordinates coord = _IntMap.at(ip);
          if (std::get<0>(coord))
            _Links.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
          else
            _Biases.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
        }

      // Set preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        _PreprocPars[ip] = Pars[_Np + ip];
    }